

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID ImGui::AddContextHook(ImGuiContext *ctx,ImGuiContextHook *hook)

{
  ImGuiContextHook *pIVar1;
  int iVar2;
  int *in_RSI;
  long in_RDI;
  ImGuiContext *g;
  ImGuiContextHook *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  uint3 in_stack_ffffffffffffffe4;
  uint uVar3;
  
  uVar3 = (uint)in_stack_ffffffffffffffe4;
  if ((*(long *)(in_RSI + 4) != 0) && (uVar3 = (uint)in_stack_ffffffffffffffe4, *in_RSI == 0)) {
    uVar3 = CONCAT13(in_RSI[1] != 7,in_stack_ffffffffffffffe4);
  }
  if ((char)(uVar3 >> 0x18) == '\0') {
    __assert_fail("hook->Callback != __null && hook->HookId == 0 && hook->Type != ImGuiContextHookType_PendingRemoval_"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0xd22,"ImGuiID ImGui::AddContextHook(ImGuiContext *, const ImGuiContextHook *)");
  }
  ImVector<ImGuiContextHook>::push_back
            ((ImVector<ImGuiContextHook> *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8);
  iVar2 = *(int *)(in_RDI + 0x2f58) + 1;
  *(int *)(in_RDI + 0x2f58) = iVar2;
  pIVar1 = ImVector<ImGuiContextHook>::back((ImVector<ImGuiContextHook> *)CONCAT44(uVar3,iVar2));
  *(int *)pIVar1 = iVar2;
  return *(ImGuiID *)(in_RDI + 0x2f58);
}

Assistant:

ImGuiID ImGui::AddContextHook(ImGuiContext* ctx, const ImGuiContextHook* hook)
{
    ImGuiContext& g = *ctx;
    IM_ASSERT(hook->Callback != NULL && hook->HookId == 0 && hook->Type != ImGuiContextHookType_PendingRemoval_);
    g.Hooks.push_back(*hook);
    g.Hooks.back().HookId = ++g.HookIdNext;
    return g.HookIdNext;
}